

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O2

void Js::CompoundString::AppendGeneric<Js::CompoundString>
               (JavascriptString *s,CharCount startIndex,CharCount appendCharLength,
               CompoundString *toString,bool appendChars)

{
  char16 c;
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  undefined4 *puVar5;
  char16 *pcVar6;
  JavascriptString *s_00;
  char16_t *pcVar7;
  CharCount startIndex_00;
  undefined7 in_register_00000081;
  ulong uVar8;
  char16_t *pcVar9;
  char16_t *pcVar10;
  void *pvVar11;
  void *local_58;
  void *packedSubstringInfo;
  void *packedSubstringInfo2;
  CharCount local_40;
  undefined4 local_3c;
  JavascriptString *local_38;
  
  if (s == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    local_38 = s;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x429,"(s)","s");
    if (!bVar3) goto LAB_00a0aea5;
    *puVar5 = 0;
    s = local_38;
  }
  cVar4 = JavascriptString::GetLength(s);
  local_38 = (JavascriptString *)CONCAT44(local_38._4_4_,startIndex);
  if (cVar4 < startIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42a,"(startIndex <= s->GetLength())",
                                "startIndex <= s->GetLength()");
    if (!bVar3) goto LAB_00a0aea5;
    *puVar5 = 0;
  }
  cVar4 = JavascriptString::GetLength(s);
  if (cVar4 - (CharCount)local_38 < appendCharLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42b,"(appendCharLength <= s->GetLength() - startIndex)",
                                "appendCharLength <= s->GetLength() - startIndex");
    if (!bVar3) goto LAB_00a0aea5;
    *puVar5 = 0;
  }
  if (toString == (CompoundString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42c,"(toString)","toString");
    if (!bVar3) goto LAB_00a0aea5;
    *puVar5 = 0;
  }
  bVar3 = JavascriptString::IsFinalized((JavascriptString *)toString);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42d,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar3) goto LAB_00a0aea5;
    *puVar5 = 0;
  }
  if (toString->ownsLastBlock == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42e,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar3) goto LAB_00a0aea5;
    *puVar5 = 0;
  }
  if ((appendChars) && (toString->directCharLength != 0xffffffff)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x42f,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                                "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar3) {
LAB_00a0aea5:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (appendCharLength == 0) {
    return;
  }
  bVar3 = Phases::IsEnabled((Phases *)&DAT_01453738,StringConcatPhase);
  pvVar11 = (void *)((ulong)local_38 & 0xffffffff);
  startIndex_00 = (CharCount)local_38;
  if (bVar3) {
    local_3c = (undefined4)CONCAT71(in_register_00000081,appendChars);
    uVar8 = 8;
    if (appendCharLength < 8) {
      uVar8 = (ulong)appendCharLength;
    }
    packedSubstringInfo2 = (void *)((ulong)local_38 & 0xffffffff);
    local_40 = appendCharLength;
    bVar3 = JavascriptString::IsFinalized(s);
    pcVar9 = L"";
    pcVar10 = L"";
    if (bVar3) {
      pcVar6 = JavascriptString::GetString(s);
      pcVar10 = pcVar6 + (long)packedSubstringInfo2;
    }
    bVar3 = JavascriptString::IsFinalized(s);
    appendCharLength = local_40;
    if (!bVar3) {
      pcVar9 = L"...";
    }
    if (8 < local_40) {
      pcVar9 = L"...";
    }
    pcVar7 = L"false";
    appendChars = SUB41(local_3c,0);
    if (appendChars != false) {
      pcVar7 = L"true";
    }
    startIndex_00 = (CharCount)local_38;
    Output::Print(L"CompoundString::AppendGeneric(JavascriptString *s = \"%.*s%s\", startIndex = %u, appendCharLength = %u, appendChars = %s)\n"
                  ,uVar8,pcVar10,pcVar9,(ulong)local_38 & 0xffffffff,(ulong)local_40,pcVar7);
    Output::Flush();
    pvVar11 = packedSubstringInfo2;
  }
  if (appendChars == false) {
    if (toString->directCharLength == 0xffffffff) {
      if (appendCharLength == 1) goto LAB_00a0addb;
      if (appendCharLength < 0xd) goto LAB_00a0ad3f;
      SwitchToPointerMode(toString);
      startIndex_00 = (CharCount)local_38;
    }
    else if (appendCharLength == 1) {
      pJVar1 = (((toString->super_LiteralString).super_JavascriptString.super_RecyclableObject.type.
                ptr)->javascriptLibrary).ptr;
      pcVar6 = GetAppendStringBuffer(toString,s);
      s_00 = CharStringCache::GetStringForChar(&pJVar1->charStringCache,pcVar6[(long)pvVar11]);
      bVar3 = TryAppendGeneric<Js::CompoundString>(s_00,1,toString);
      if (bVar3) {
        return;
      }
      AppendSlow(toString,s_00);
      return;
    }
    PackSubstringInfo(startIndex_00,appendCharLength,&local_58,&packedSubstringInfo);
    bVar3 = TryAppendGeneric<Js::CompoundString>
                      (s,local_58,packedSubstringInfo,appendCharLength,toString);
    if (!bVar3) {
      AppendSlow(toString,s,local_58,packedSubstringInfo,appendCharLength);
    }
  }
  else {
    if (appendCharLength != 1) {
LAB_00a0ad3f:
      pcVar6 = GetAppendStringBuffer(toString,s);
      pcVar6 = pcVar6 + (long)pvVar11;
      if (appendChars == false) {
        bVar3 = TryAppendFewCharsGeneric<Js::CompoundString>(pcVar6,appendCharLength,toString);
      }
      else {
        bVar3 = TryAppendGeneric<Js::CompoundString>(pcVar6,appendCharLength,toString);
      }
      if (bVar3 != false) {
        return;
      }
      AppendSlow(toString,pcVar6,appendCharLength);
      return;
    }
LAB_00a0addb:
    pcVar6 = GetAppendStringBuffer(toString,s);
    c = pcVar6[(long)pvVar11];
    bVar3 = TryAppendGeneric<Js::CompoundString>(c,toString);
    if (!bVar3) {
      AppendSlow(toString,c);
      return;
    }
  }
  return;
}

Assistant:

inline void CompoundString::AppendGeneric(
        JavascriptString *const s,
        const CharCount startIndex,
        const CharCount appendCharLength,
        String *const toString,
        const bool appendChars)
    {
        Assert(s);
        Assert(startIndex <= s->GetLength());
        Assert(appendCharLength <= s->GetLength() - startIndex);
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(!(appendChars && !toString->HasOnlyDirectChars()));

        if(appendCharLength == 0)
            return;

        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("CompoundString::AppendGeneric(JavascriptString *s = \"%.*s%s\", startIndex = %u, appendCharLength = %u, appendChars = %s)\n"),
                min(static_cast<CharCount>(8), appendCharLength),
                s->IsFinalized() ? &s->GetString()[startIndex] : _u(""),
                !s->IsFinalized() || appendCharLength > 8 ? _u("...") : _u(""),
                startIndex,
                appendCharLength,
                appendChars ? _u("true") : _u("false"));
            Output::Flush();
        }

        if(appendChars || toString->HasOnlyDirectChars())
        {
            if(appendCharLength == 1)
            {
                const char16 c = toString->GetAppendStringBuffer(s)[startIndex];
                if(TryAppendGeneric(c, toString))
                    return;
                toString->AppendSlow(c);
                return;
            }

            if(appendChars || Block::ShouldAppendChars(appendCharLength, sizeof(void *)))
            {
                const char16 *const appendBuffer = &toString->GetAppendStringBuffer(s)[startIndex];
                if(appendChars
                        ? TryAppendGeneric(appendBuffer, appendCharLength, toString)
                        : TryAppendFewCharsGeneric(appendBuffer, appendCharLength, toString))
                {
                    return;
                }
                toString->AppendSlow(appendBuffer, appendCharLength);
                return;
            }

            toString->SwitchToPointerMode();
        }

        if(appendCharLength == 1)
        {
            JavascriptString *const js =
                toString->GetLibrary()->GetCharStringCache().GetStringForChar(toString->GetAppendStringBuffer(s)[startIndex]);
            if(TryAppendGeneric(js, 1, toString))
                return;
            toString->AppendSlow(js);
            return;
        }

        void *packedSubstringInfo, *packedSubstringInfo2;
        PackSubstringInfo(startIndex, appendCharLength, &packedSubstringInfo, &packedSubstringInfo2);
        if(TryAppendGeneric(s, packedSubstringInfo, packedSubstringInfo2, appendCharLength, toString))
            return;
        toString->AppendSlow(s, packedSubstringInfo, packedSubstringInfo2, appendCharLength);
    }